

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

ssize_t __thiscall
duckdb_httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 in_register_00000034;
  uint uVar2;
  
  std::recursive_mutex::lock(&this->request_mutex_);
  bVar1 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,(Error *)__n);
  uVar2 = (uint)CONCAT71(extraout_var,bVar1);
  if (*(int *)__n == 0xf) {
    bVar1 = send_(this,(Request *)CONCAT44(in_register_00000034,__fd),(Response *)__buf,(Error *)__n
                 );
    uVar2 = (uint)CONCAT71(extraout_var_00,bVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->request_mutex_);
  return (ulong)uVar2;
}

Assistant:

inline bool ClientImpl::send(Request &req, Response &res, Error &error) {
  std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);
  auto ret = send_(req, res, error);
  if (error == Error::SSLPeerCouldBeClosed_) {
    assert(!ret);
    ret = send_(req, res, error);
  }
  return ret;
}